

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

pair<bool,_Point> intersection(Segment *segment,Plane *plane)

{
  Point *pPVar1;
  Point p;
  bool bVar2;
  float fVar3;
  Point PVar4;
  Point local_108 [2];
  Point local_e8 [4];
  Point local_b8;
  undefined8 local_a8;
  float local_a0;
  Point local_98;
  bool local_89;
  Point local_88;
  bool local_79;
  float local_78;
  float local_74;
  float t;
  float local_6c;
  bool local_65;
  float local_64;
  float fStack_60;
  float x;
  float local_58;
  undefined8 local_50;
  float local_48;
  undefined8 local_40;
  float local_38;
  undefined1 local_34 [8];
  Vector V;
  Plane *plane_local;
  Segment *segment_local;
  
  local_48 = (segment->b).z;
  pPVar1 = &segment->b;
  local_50._0_4_ = pPVar1->x;
  local_50._4_4_ = pPVar1->y;
  local_40 = local_50;
  local_38 = local_48;
  V._4_8_ = plane;
  PVar4 = operator-(*pPVar1,&segment->a);
  _fStack_60 = PVar4._0_8_;
  local_34._0_4_ = fStack_60;
  local_34._4_4_ = x;
  local_58 = PVar4.z;
  V.x = local_58;
  _fStack_60 = PVar4;
  local_64 = dotProduct((Vector *)local_34,(Vector *)(V._4_8_ + 0xc));
  if ((local_64 != 0.0) || (NAN(local_64))) {
    fVar3 = dotProduct(&segment->a,(Vector *)(V._4_8_ + 0xc));
    local_78 = -(fVar3 + *(float *)(V._4_8_ + 0x18)) / local_64;
    if ((0.0 <= local_78) && (bVar2 = isCloseToZero<float>(local_78), !bVar2)) {
      local_89 = true;
      local_a0 = (segment->a).z;
      local_a8._0_4_ = (segment->a).x;
      local_a8._4_4_ = (segment->a).y;
      p.z = V.x;
      p.x = (float)local_34._0_4_;
      p.y = (float)local_34._4_4_;
      PVar4 = operator*(p,local_78);
      local_e8[0].z = PVar4.z;
      local_b8.z = local_e8[0].z;
      local_e8[0]._0_8_ = PVar4._0_8_;
      local_b8.x = local_e8[0].x;
      local_b8.y = local_e8[0].y;
      PVar4.z = local_a0;
      PVar4.x = (float)(undefined4)local_a8;
      PVar4.y = (float)local_a8._4_4_;
      PVar4 = operator+(PVar4,&local_b8);
      local_108[0]._0_8_ = PVar4._0_8_;
      local_98.x = local_108[0].x;
      local_98.y = local_108[0].y;
      local_108[0].z = PVar4.z;
      local_98.z = local_108[0].z;
      std::pair<bool,_Point>::pair<bool,_Point,_true>
                ((pair<bool,_Point> *)&segment_local,&local_89,&local_98);
      return _segment_local;
    }
    local_79 = false;
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    std::pair<bool,_Point>::pair<bool,_true>
              ((pair<bool,_Point> *)&segment_local,&local_79,&local_88);
  }
  else {
    local_65 = false;
    local_74 = 0.0;
    t = 0.0;
    local_6c = 0.0;
    std::pair<bool,_Point>::pair<bool,_true>
              ((pair<bool,_Point> *)&segment_local,&local_65,(Point *)&stack0xffffffffffffff8c);
  }
  return _segment_local;
}

Assistant:

std::pair<bool, Point> intersection(Segment const& segment, Plane const& plane)
{
  Vector V = segment.b - segment.a;
  float x = dotProduct(V, plane.normal);
  if (x == 0)
    return {false, {}};

  float t = -(dotProduct(segment.a, plane.normal) + plane.d) / x;
  if (t < 0 || isCloseToZero(t))
    return {false, {}};

  return {true, segment.a + V * t};
}